

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tiled_Image.cxx
# Opt level: O1

void __thiscall Fl_Tiled_Image::desaturate(Fl_Tiled_Image *this)

{
  Fl_Image *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (this->alloc_image_ == 0) {
    pFVar1 = this->image_;
    iVar2 = (*pFVar1->_vptr_Fl_Image[2])(pFVar1,(ulong)(uint)pFVar1->w_,(ulong)(uint)pFVar1->h_);
    this->image_ = (Fl_Image *)CONCAT44(extraout_var,iVar2);
    this->alloc_image_ = 1;
  }
  (*this->image_->_vptr_Fl_Image[4])();
  return;
}

Assistant:

void
Fl_Tiled_Image::desaturate() {
  if (!alloc_image_) {
    image_       = image_->copy();
    alloc_image_ = 1;
  }

  image_->desaturate();
}